

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O3

int Prs_CreateBitSignal(Prs_Ntk_t *pNtk,int Sig)

{
  char cVar1;
  int *piVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  
  if (-1 < Sig) {
    uVar8 = (uint)Sig >> 2;
    uVar5 = 0xffffffff;
    if (1 < (Sig & 3U)) {
      if ((Sig & 3U) == 2) {
        pcVar6 = Abc_NamStr(pNtk->pFuns,uVar8);
        pcVar6 = strchr(pcVar6,0x27);
        if (pcVar6[1] != 'b') {
          __assert_fail("*pConst == \'b\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                        ,0x679,"int Prs_CreateBitSignal(Prs_Ntk_t *, int)");
        }
        pcVar6 = pcVar6 + 1;
        bVar3 = true;
        bVar7 = false;
        while( true ) {
          pcVar6 = pcVar6 + 1;
          cVar1 = *pcVar6;
          if (cVar1 == '\0') break;
          if (cVar1 == '0') {
            bVar3 = false;
          }
          else if (cVar1 == '1') {
            bVar7 = true;
          }
        }
        uVar5 = 6;
        if (bVar7) {
          uVar5 = -(uint)!bVar3 | 10;
        }
      }
      else {
        uVar5 = (pNtk->vConcats).nSize;
        if ((int)uVar5 <= (int)uVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar2 = (pNtk->vConcats).pArray;
        Prs_CatSignals_V_1 = piVar2[uVar8];
        if (uVar5 <= uVar8 + 1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        Prs_CatSignals_V_2 = piVar2 + (uVar8 + 1);
        if ((int)Prs_CatSignals_V_1 < 1) {
          __assert_fail("SigOne >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                        ,0x692,"int Prs_CreateBitSignal(Prs_Ntk_t *, int)");
        }
        uVar5 = 0xffffffff;
        uVar9 = 0;
        do {
          uVar8 = Prs_CatSignals_V_2[uVar9];
          if ((int)uVar8 < 0) goto LAB_003e4396;
          if ((uVar8 & 3) != 0) {
            return -1;
          }
          uVar4 = uVar8 >> 2;
          if ((uVar5 != 0xffffffff) && (uVar4 = uVar5, uVar5 != uVar8 >> 2)) {
            return -1;
          }
          uVar5 = uVar4;
          uVar9 = uVar9 + 1;
        } while (Prs_CatSignals_V_1 != uVar9);
        uVar5 = uVar5 << 2;
      }
    }
    return uVar5;
  }
LAB_003e4396:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x13d,"int Abc_Lit2Var2(int)");
}

Assistant:

int Prs_CreateBitSignal( Prs_Ntk_t * pNtk, int Sig )
{
    Vec_Int_t * vSigs;
    int i, SigTemp, SigOne = -1, Value = Abc_Lit2Var2( Sig );
    Prs_ManType_t Type = (Prs_ManType_t)Abc_Lit2Att2( Sig );
    if ( Type == CBA_PRS_NAME || Type == CBA_PRS_SLICE )
        return -1;
    if ( Type == CBA_PRS_CONST )
    {
        int fOnly0 = 1, fOnly1 = 1;
        char * pConst = Prs_NtkConst(pNtk, Value);
        pConst = strchr( pConst, '\'' ) + 1;
        assert( *pConst == 'b' );
        while ( *++pConst )
            if ( *pConst == '0' )
                fOnly1 = 0;
            else if ( *pConst == '1' )
                fOnly0 = 0;
        if ( fOnly0 )
            return Abc_Var2Lit2( 1, CBA_PRS_CONST ); // const0
        if ( fOnly1 )
            return Abc_Var2Lit2( 2, CBA_PRS_CONST ); // const1
        return -1;
    }
    assert( Type == CBA_PRS_CONCAT );
    vSigs = Prs_CatSignals( pNtk, Value );
    Vec_IntForEachEntry( vSigs, SigTemp, i )
    {
        Value = Abc_Lit2Var2( SigTemp );
        Type = (Prs_ManType_t)Abc_Lit2Att2( SigTemp );
        if ( Type != CBA_PRS_NAME )
            return -1;
        if ( SigOne == -1 )
            SigOne = Value;
        else if ( SigOne != Value )
            return -1;
    }
    assert( SigOne >= 0 );
    return Abc_Var2Lit2( SigOne, CBA_PRS_NAME );
}